

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_stbvorbis_init_internal_decoder_push(ma_stbvorbis *pVorbis)

{
  ma_allocation_callbacks *pAllocationCallbacks;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var1;
  ma_result mVar2;
  uchar *data;
  stb_vorbis *psVar3;
  _func_void_void_ptr_void_ptr *p_Var4;
  uchar *p;
  ulong uVar5;
  size_t sVar6;
  size_t sVar7;
  int consumedDataSize;
  int vorbisError;
  size_t bytesRead;
  
  pAllocationCallbacks = &pVorbis->allocationCallbacks;
  sVar7 = 0x1000;
  uVar5 = 0;
  p = (uchar *)0x0;
  while( true ) {
    p_Var1 = (pVorbis->allocationCallbacks).onRealloc;
    if ((p_Var1 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) ||
       (data = (uchar *)(*p_Var1)(p,sVar7,pAllocationCallbacks->pUserData), data == (uchar *)0x0)) {
      ma_free(p,pAllocationCallbacks);
      return MA_OUT_OF_MEMORY;
    }
    mVar2 = (*pVorbis->onRead)(pVorbis->pReadSeekTellUserData,data + uVar5,sVar7 - uVar5,&bytesRead)
    ;
    if (mVar2 != MA_SUCCESS) break;
    uVar5 = uVar5 + bytesRead;
    if (uVar5 >> 0x1f != 0) {
      p_Var4 = (pVorbis->allocationCallbacks).onFree;
      mVar2 = MA_TOO_BIG;
      goto LAB_0014e4c5;
    }
    psVar3 = stb_vorbis_open_pushdata
                       (data,(int)uVar5,&consumedDataSize,&vorbisError,(stb_vorbis_alloc *)0x0);
    if (psVar3 != (stb_vorbis *)0x0) {
      sVar6 = (size_t)consumedDataSize;
      memmove(data,data + sVar6,uVar5 - sVar6);
      (pVorbis->push).audioStartOffsetInBytes = sVar6;
      pVorbis->stb = psVar3;
      (pVorbis->push).pData = data;
      (pVorbis->push).dataSize = uVar5 - sVar6;
      (pVorbis->push).dataCapacity = sVar7;
      return MA_SUCCESS;
    }
    if (vorbisError != 1) {
      p_Var4 = (pVorbis->allocationCallbacks).onFree;
      mVar2 = MA_ERROR;
      goto LAB_0014e4c5;
    }
    sVar7 = sVar7 + 0x1000;
    p = data;
  }
  p_Var4 = (pVorbis->allocationCallbacks).onFree;
LAB_0014e4c5:
  if (p_Var4 == (_func_void_void_ptr_void_ptr *)0x0) {
    return mVar2;
  }
  (*p_Var4)(data,pAllocationCallbacks->pUserData);
  return mVar2;
}

Assistant:

static ma_result ma_stbvorbis_init_internal_decoder_push(ma_stbvorbis* pVorbis)
{
    ma_result result;
    stb_vorbis* stb;
    size_t dataSize = 0;
    size_t dataCapacity = 0;
    ma_uint8* pData = NULL; /* <-- Must be initialized to NULL. */

    for (;;) {
        int vorbisError;
        int consumedDataSize;   /* <-- Fill by stb_vorbis_open_pushdata(). */
        size_t bytesRead;
        ma_uint8* pNewData;

        /* Allocate memory for the new chunk. */
        dataCapacity += MA_VORBIS_DATA_CHUNK_SIZE;
        pNewData = (ma_uint8*)ma_realloc(pData, dataCapacity, &pVorbis->allocationCallbacks);
        if (pNewData == NULL) {
            ma_free(pData, &pVorbis->allocationCallbacks);
            return MA_OUT_OF_MEMORY;
        }

        pData = pNewData;

        /* Read in the next chunk. */
        result = pVorbis->onRead(pVorbis->pReadSeekTellUserData, ma_offset_ptr(pData, dataSize), (dataCapacity - dataSize), &bytesRead);
        dataSize += bytesRead;

        if (result != MA_SUCCESS) {
            ma_free(pData, &pVorbis->allocationCallbacks);
            return result;
        }

        /* We have a maximum of 31 bits with stb_vorbis. */
        if (dataSize > INT_MAX) {
            ma_free(pData, &pVorbis->allocationCallbacks);
            return MA_TOO_BIG;
        }

        stb = stb_vorbis_open_pushdata(pData, (int)dataSize, &consumedDataSize, &vorbisError, NULL);
        if (stb != NULL) {
            /*
            Successfully opened the Vorbis decoder. We might have some leftover unprocessed
            data so we'll need to move that down to the front.
            */
            dataSize -= (size_t)consumedDataSize;   /* Consume the data. */
            MA_MOVE_MEMORY(pData, ma_offset_ptr(pData, consumedDataSize), dataSize);

            /*
            We need to track the start point so we can seek back to the start of the audio
            data when seeking.
            */
            pVorbis->push.audioStartOffsetInBytes = consumedDataSize;

            break;
        } else {
            /* Failed to open the decoder. */
            if (vorbisError == VORBIS_need_more_data) {
                continue;
            } else {
                ma_free(pData, &pVorbis->allocationCallbacks);
                return MA_ERROR;   /* Failed to open the stb_vorbis decoder. */
            }
        }
    }

    MA_ASSERT(stb != NULL);
    pVorbis->stb = stb;
    pVorbis->push.pData = pData;
    pVorbis->push.dataSize = dataSize;
    pVorbis->push.dataCapacity = dataCapacity;

    return MA_SUCCESS;
}